

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall VmaAllocator_T::DestroyPool(VmaAllocator_T *this,VmaPool pool)

{
  size_t *psVar1;
  bool bVar2;
  VmaPool_T *pVVar3;
  int iVar4;
  VmaPool_T **ppVVar5;
  PoolList *pPVar6;
  
  bVar2 = this->m_UseMutex;
  if (bVar2 == true) {
    iVar4 = pthread_rwlock_wrlock((pthread_rwlock_t *)&this->m_PoolsMutex);
    if (iVar4 == 0x23) {
      std::__throw_system_error(0x23);
    }
  }
  pVVar3 = pool->m_NextPool;
  pPVar6 = (PoolList *)&pool->m_PrevPool->m_NextPool;
  if (pool->m_PrevPool == (VmaPool_T *)0x0) {
    pPVar6 = &this->m_Pools;
  }
  pPVar6->m_Front = pVVar3;
  ppVVar5 = &pVVar3->m_PrevPool;
  if (pVVar3 == (VmaPool_T *)0x0) {
    ppVVar5 = &(this->m_Pools).m_Back;
  }
  *ppVVar5 = pool->m_PrevPool;
  pool->m_PrevPool = (VmaPool_T *)0x0;
  pool->m_NextPool = (VmaPool_T *)0x0;
  psVar1 = &(this->m_Pools).m_Count;
  *psVar1 = *psVar1 - 1;
  if (bVar2 != false) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->m_PoolsMutex);
  }
  vma_delete<VmaPool_T>(this,pool);
  return;
}

Assistant:

void VmaAllocator_T::DestroyPool(VmaPool pool)
{
    // Remove from m_Pools.
    {
        VmaMutexLockWrite lock(m_PoolsMutex, m_UseMutex);
        m_Pools.Remove(pool);
    }

    vma_delete(this, pool);
}